

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTessellation.cpp
# Opt level: O2

void __thiscall
glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::initTest
          (TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID *this)

{
  GLuint *pGVar1;
  bool is_indiced;
  _tessellation_primitive_mode primitive_mode;
  GLint n_patch_vertices_00;
  GLint n_instances;
  int iVar2;
  GLenum GVar3;
  GLuint GVar4;
  undefined4 extraout_var;
  TessellationShaderUtils *this_00;
  long lVar5;
  long lVar6;
  NotSupportedError *this_01;
  long lVar7;
  long lVar8;
  long lVar9;
  GLint n_patch_vertices [3];
  GLint gl_max_patch_vertices_value;
  _run run;
  undefined8 local_48;
  char *vs_body;
  char *fs_body;
  Functions *gl;
  
  if ((this->super_TestCaseBase).m_is_tessellation_shader_supported != false) {
    iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    gl = (Functions *)CONCAT44(extraout_var,iVar2);
    this_00 = (TessellationShaderUtils *)operator_new(0x20);
    TessellationShaderUtils::TessellationShaderUtils(this_00,gl,&this->super_TestCaseBase);
    this->m_utils_ptr = this_00;
    (*gl->genVertexArrays)(1,&this->m_vao_id);
    GVar3 = (*gl->getError)();
    glu::checkError(GVar3,"Could not generate vertex array object",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x3f4);
    (*gl->bindVertexArray)(this->m_vao_id);
    GVar3 = (*gl->getError)();
    glu::checkError(GVar3,"Error binding vertex array object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x3f7);
    pGVar1 = &this->m_bo_id;
    (*gl->genBuffers)(1,pGVar1);
    GVar3 = (*gl->getError)();
    glu::checkError(GVar3,"glGenBuffers() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x3fb);
    GVar4 = (*gl->createShader)(0x8b30);
    this->m_fs_id = GVar4;
    GVar4 = (*gl->createShader)(0x8b31);
    this->m_vs_id = GVar4;
    GVar3 = (*gl->getError)();
    glu::checkError(GVar3,"glCreateShader() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x3ff);
    fs_body = "${VERSION}\n\nvoid main()\n{\n}\n";
    TestCaseBase::shaderSourceSpecialized(&this->super_TestCaseBase,this->m_fs_id,1,&fs_body);
    GVar3 = (*gl->getError)();
    glu::checkError(GVar3,"glShaderSource() failed for fragment shader",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x409);
    vs_body = 
    "${VERSION}\n\nin vec4 vertex_data;\n\nvoid main()\n{\n    gl_Position = vertex_data;\n}\n";
    TestCaseBase::shaderSourceSpecialized(&this->super_TestCaseBase,this->m_vs_id,1,&vs_body);
    GVar3 = (*gl->getError)();
    glu::checkError(GVar3,"glShaderSource() failed for vertex shader",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x416);
    local_48._0_4_ = this->m_fs_id;
    local_48._4_4_ = this->m_vs_id;
    TessellationShaderUtils::compileShaders(this->m_utils_ptr,2,(GLuint *)&local_48,true);
    gl_max_patch_vertices_value = 0;
    (*gl->getIntegerv)((this->super_TestCaseBase).m_glExtTokens.MAX_PATCH_VERTICES,
                       &gl_max_patch_vertices_value);
    GVar3 = (*gl->getError)();
    glu::checkError(GVar3,"glGetIntegerv() failed for GL_MAX_PATCH_VERTICES_EXT pname",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x422);
    n_patch_vertices[0] = 4;
    n_patch_vertices[1] = gl_max_patch_vertices_value / 2;
    n_patch_vertices[2] = gl_max_patch_vertices_value;
    for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
      primitive_mode = (&DAT_017b9170)[lVar6];
      for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
        n_patch_vertices_00 = n_patch_vertices[lVar5];
        for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
          is_indiced = (bool)(&DAT_017b916c)[lVar8];
          for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
            n_instances = (&DAT_017b9164)[lVar7];
            for (lVar9 = 0; lVar9 != 8; lVar9 = lVar9 + 4) {
              run.drawcall_is_indiced = false;
              run.bo_indices_id = 0;
              run.drawcall_count_multiplier = 0;
              run.drawcall_n_instances = 0;
              run.n_instances = 0;
              run.n_patch_vertices = 0;
              run.n_restart_indices = 0;
              run.n_result_vertices = 0;
              run.po_id = 0;
              run.primitive_mode = TESSELLATION_SHADER_PRIMITIVE_MODE_COUNT;
              run.tc_id = 0;
              run.te_id = 0;
              initRun(this,&run,primitive_mode,n_patch_vertices_00,is_indiced,n_instances,
                      *(uint *)((long)&DAT_017b915c + lVar9));
              std::
              vector<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run,_std::allocator<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run>_>
              ::push_back(&this->m_runs,&run);
            }
          }
        }
      }
    }
    (*gl->bindBuffer)(0x8c8e,*pGVar1);
    GVar3 = (*gl->getError)();
    glu::checkError(GVar3,"glBindBuffer() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x45e);
    (*gl->bindBufferBase)(0x8c8e,0,*pGVar1);
    GVar3 = (*gl->getError)();
    glu::checkError(GVar3,"glBindBufferBase() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x461);
    return;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&run,"Tessellation shader functionality not supported, skipping",
             (allocator<char> *)n_patch_vertices);
  tcu::NotSupportedError::NotSupportedError(this_01,(string *)&run);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::initTest()
{
	/* Skip if required extensions are not supported. */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	/* Set up Utils instance */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	m_utils_ptr = new TessellationShaderUtils(gl, this);

	/* Initialize vertex array object */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate vertex array object");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding vertex array object!");

	/* Generate all test-wide objects needed for test execution */
	gl.genBuffers(1, &m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() failed");

	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() failed");

	/* Configure fragment shader body */
	const char* fs_body = "${VERSION}\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "}\n";

	shaderSourceSpecialized(m_fs_id, 1 /* count */, &fs_body);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed for fragment shader");

	/* Configure vertex shader body */
	const char* vs_body = "${VERSION}\n"
						  "\n"
						  "in vec4 vertex_data;\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    gl_Position = vertex_data;\n"
						  "}\n";

	shaderSourceSpecialized(m_vs_id, 1 /* count */, &vs_body);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed for vertex shader");

	/* Compile all the shaders */
	const glw::GLuint  shaders[] = { m_fs_id, m_vs_id };
	const unsigned int n_shaders = sizeof(shaders) / sizeof(shaders[0]);

	m_utils_ptr->compileShaders(n_shaders, shaders, true /* should_succeed */);

	/* Retrieve GL_MAX_PATCH_VERTICES_EXT value before we continue */
	glw::GLint gl_max_patch_vertices_value = 0;

	gl.getIntegerv(m_glExtTokens.MAX_PATCH_VERTICES, &gl_max_patch_vertices_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_PATCH_VERTICES_EXT pname");

	/* Initialize all test passes */
	const unsigned int drawcall_count_multipliers[] = { 3, 6 };
	const bool		   is_indiced_draw_call_flags[] = { false, true };
	const glw::GLint   n_instances[]				= { 1, 4 };
	const glw::GLint   n_patch_vertices[] = { 4, gl_max_patch_vertices_value / 2, gl_max_patch_vertices_value };
	const _tessellation_primitive_mode primitive_modes[] = { TESSELLATION_SHADER_PRIMITIVE_MODE_ISOLINES,
															 TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS,
															 TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES };
	const unsigned int n_drawcall_count_multipliers =
		sizeof(drawcall_count_multipliers) / sizeof(drawcall_count_multipliers[0]);
	const unsigned int n_is_indiced_draw_call_flags =
		sizeof(is_indiced_draw_call_flags) / sizeof(is_indiced_draw_call_flags[0]);
	const unsigned int n_n_instances	  = sizeof(n_instances) / sizeof(n_instances[0]);
	const unsigned int n_n_patch_vertices = sizeof(n_patch_vertices) / sizeof(n_patch_vertices[0]);
	const unsigned int n_primitive_modes  = sizeof(primitive_modes) / sizeof(primitive_modes[0]);

	for (unsigned int n_primitive_mode = 0; n_primitive_mode < n_primitive_modes; ++n_primitive_mode)
	{
		_tessellation_primitive_mode current_primitive_mode = primitive_modes[n_primitive_mode];

		for (unsigned int n_patch_vertices_item = 0; n_patch_vertices_item < n_n_patch_vertices;
			 ++n_patch_vertices_item)
		{
			glw::GLint current_n_patch_vertices = n_patch_vertices[n_patch_vertices_item];

			for (unsigned int n_is_indiced_draw_call_flag = 0;
				 n_is_indiced_draw_call_flag < n_is_indiced_draw_call_flags; ++n_is_indiced_draw_call_flag)
			{
				bool current_is_indiced_draw_call = is_indiced_draw_call_flags[n_is_indiced_draw_call_flag];

				for (unsigned int n_instances_item = 0; n_instances_item < n_n_instances; ++n_instances_item)
				{
					glw::GLint current_n_instances = n_instances[n_instances_item];

					for (unsigned int n_drawcall_count_multiplier = 0;
						 n_drawcall_count_multiplier < n_drawcall_count_multipliers; ++n_drawcall_count_multiplier)
					{
						const unsigned int drawcall_count_multiplier =
							drawcall_count_multipliers[n_drawcall_count_multiplier];

						/* Form the run descriptor */
						_run run;

						initRun(run, current_primitive_mode, current_n_patch_vertices, current_is_indiced_draw_call,
								current_n_instances, drawcall_count_multiplier);

						/* Store the descriptor for later execution */
						m_runs.push_back(run);
					}
				} /* for (all 'number of instances' settings) */
			}	 /* for (all 'is indiced draw call' flags) */
		}		  /* for (all 'n patch vertices' settings) */
	}			  /* for (all primitive modes) */

	/* Set up buffer object bindings. Storage size will be determined on
	 * a per-iteration basis.
	 **/
	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() failed");

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* index */, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() failed");
}